

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

string * bech32::encodeBasis(string *__return_storage_ptr__,string *hrp,
                            vector<unsigned_char,_std::allocator<unsigned_char>_> *dp,
                            _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_string_ptr_vector<unsigned_char,_std::allocator<unsigned_char>_>_ptr
                            *checksumFunc)

{
  pointer puVar1;
  runtime_error *prVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  long lVar7;
  byte *pbVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> combined;
  vector<unsigned_char,_std::allocator<unsigned_char>_> checksum;
  string hrpCopy;
  
  anon_unknown.dwarf_199c::rejectHRPTooShort(hrp);
  anon_unknown.dwarf_199c::rejectHRPTooLong(hrp);
  puVar3 = (dp->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (dp->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 + (hrp->_M_string_length - (long)puVar3) + -0x54 < (pointer)0xffffffffffffffa5) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"length of hrp + length of dp is too large");
    goto LAB_00102bcd;
  }
  lVar6 = (long)puVar1 - (long)puVar3;
  puVar3 = puVar3 + 1;
  for (lVar7 = lVar6 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
    if ('\x1f' < (char)puVar3[-1]) {
      puVar3 = puVar3 + -1;
      goto LAB_00102a81;
    }
    if ('\x1f' < (char)*puVar3) goto LAB_00102a81;
    if ('\x1f' < (char)puVar3[1]) {
      puVar3 = puVar3 + 1;
      goto LAB_00102a81;
    }
    if ('\x1f' < (char)puVar3[2]) {
      puVar3 = puVar3 + 2;
      goto LAB_00102a81;
    }
    puVar3 = puVar3 + 4;
    lVar6 = lVar6 + -4;
  }
  puVar5 = puVar3 + -1;
  if (lVar6 == 1) {
LAB_00102b5b:
    puVar3 = puVar5;
    if ((char)*puVar5 < ' ') {
      puVar3 = puVar1;
    }
  }
  else if (lVar6 == 3) {
    puVar4 = puVar3;
    puVar3 = puVar5;
    if ((char)*puVar5 < ' ') goto LAB_00102b4c;
  }
  else {
    puVar4 = puVar5;
    if (lVar6 != 2) goto LAB_00102a8a;
LAB_00102b4c:
    puVar3 = puVar4;
    if ((char)*puVar4 < ' ') {
      puVar5 = puVar4 + 1;
      goto LAB_00102b5b;
    }
  }
LAB_00102a81:
  if (puVar3 == puVar1) {
LAB_00102a8a:
    std::__cxx11::string::string((string *)&hrpCopy,(string *)hrp);
    anon_unknown.dwarf_199c::convertToLowercase(&hrpCopy);
    (*checksumFunc)(&checksum,&hrpCopy,dp);
    std::operator+(__return_storage_ptr__,&hrpCopy,'1');
    anon_unknown.dwarf_199c::cat(&combined,dp,&checksum);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pbVar8 = combined.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar8 == combined.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&combined.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&checksum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&hrpCopy);
        return __return_storage_ptr__;
      }
      if (0x1f < *pbVar8) break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pbVar8 = pbVar8 + 1;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"data part contains invalid character");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"data value is out of range");
LAB_00102bcd:
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string encodeBasis(const std::string &hrp, const std::vector<unsigned char> &dp,
                            std::vector<unsigned char> (*checksumFunc)(const std::string &, const std::vector<unsigned char> &)) {
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectBothPartsTooLong(hrp, dp);
        rejectDataValuesOutOfRange(dp);

        std::string hrpCopy = hrp;
        convertToLowercase(hrpCopy);
        std::vector<unsigned char> checksum = checksumFunc(hrpCopy, dp);
        std::string ret = hrpCopy + '1';
        std::vector<unsigned char> combined = cat(dp, checksum);
        ret.reserve(ret.size() + combined.size());
        for (unsigned char c : combined) {
            if(c > limits::VALID_CHARSET_SIZE - 1)
                throw std::runtime_error("data part contains invalid character");
            ret += charset[c];
        }
        return ret;
    }